

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  undefined4 uVar1;
  uint i;
  int iVar2;
  undefined8 in_RAX;
  container_t *c;
  array_container_t *c_00;
  container_t *pcVar3;
  uint16_t x;
  undefined3 uStack_38;
  uint8_t newtypecode;
  uint8_t local_35;
  int local_34;
  
  x = (uint16_t)(val >> 0x10);
  _uStack_38 = in_RAX;
  i = ra_get_index(&r->high_low_container,x);
  if ((int)i < 0) {
    c_00 = array_container_create();
    pcVar3 = container_add(c_00,(uint16_t)val,'\x02',&stack0xffffffffffffffcb);
    ra_insert_new_key_value_at(&r->high_low_container,~i,x,pcVar3,local_35);
  }
  else {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)i);
    typecode = (r->high_low_container).typecodes[i & 0xffff];
    pcVar3 = (r->high_low_container).containers[i & 0xffff];
    iVar2 = container_get_cardinality(pcVar3,typecode);
    uVar1 = _uStack_38;
    _uStack_38 = CONCAT44(iVar2,_uStack_38);
    uStack_38 = CONCAT12(typecode,(short)uVar1);
    c = container_add(pcVar3,(uint16_t)val,typecode,&newtypecode);
    if (c == pcVar3) {
      iVar2 = container_get_cardinality(pcVar3,newtypecode);
      return local_34 != iVar2;
    }
    container_free(pcVar3,typecode);
    ra_set_container_at_index(&r->high_low_container,i,c,newtypecode);
  }
  return true;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}